

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

unsigned_short toml::from_string<unsigned_short,unsigned_int>(string *str,uint *opt)

{
  unsigned_short uVar1;
  istringstream local_1a0 [8];
  istringstream iss;
  unsigned_short local_1a;
  uint *puStack_18;
  unsigned_short v;
  uint *opt_local;
  string *str_local;
  
  local_1a = (unsigned_short)*opt;
  puStack_18 = opt;
  opt_local = (uint *)str;
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)str,_S_in);
  std::istream::operator>>(local_1a0,&local_1a);
  uVar1 = local_1a;
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return uVar1;
}

Assistant:

T from_string(const std::string& str, U&& opt)
{
    T v(static_cast<T>(std::forward<U>(opt)));
    std::istringstream iss(str);
    iss >> v;
    return v;
}